

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void vmaFreeMemoryPages(VmaAllocator allocator,size_t allocationCount,VmaAllocation *pAllocations)

{
  VmaAllocation allocation;
  char *__ptr;
  VkAllocationCallbacks *pVVar1;
  VmaPool this;
  
  if (allocationCount != 0) {
    if (allocationCount != 0) {
      do {
        allocation = pAllocations[allocationCount - 1];
        if (allocation != (VmaAllocation)0x0) {
          __ptr = allocation->m_pName;
          if (__ptr != (char *)0x0) {
            pVVar1 = (VkAllocationCallbacks *)0x0;
            if (allocator->m_AllocationCallbacksSpecified != false) {
              pVVar1 = &allocator->m_AllocationCallbacks;
            }
            if ((allocator->m_AllocationCallbacksSpecified == true) &&
               (pVVar1->pfnFree != (PFN_vkFreeFunction)0x0)) {
              (*pVVar1->pfnFree)(pVVar1->pUserData,__ptr);
            }
            else {
              free(__ptr);
            }
            allocation->m_pName = (char *)0x0;
          }
          if (allocation->m_Type == '\x02') {
            VmaAllocator_T::FreeDedicatedMemory(allocator,allocation);
          }
          else if (allocation->m_Type == '\x01') {
            this = ((allocation->field_0).m_BlockAllocation.m_Block)->m_hParentPool;
            if (this == (VmaPool)0x0) {
              this = (VmaPool)allocator->m_pBlockVectors[allocation->m_MemoryTypeIndex];
            }
            VmaBlockVector::Free(&this->m_BlockVector,allocation);
          }
        }
        allocationCount = allocationCount - 1;
      } while (allocationCount != 0);
    }
    return;
  }
  return;
}

Assistant:

VMA_CALL_PRE void VMA_CALL_POST vmaFreeMemoryPages(
    VmaAllocator allocator,
    size_t allocationCount,
    const VmaAllocation* pAllocations)
{
    if(allocationCount == 0)
    {
        return;
    }

    VMA_ASSERT(allocator);

    VMA_DEBUG_LOG("vmaFreeMemoryPages");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    allocator->FreeMemory(allocationCount, pAllocations);
}